

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O3

void tgen_arithi(TCGContext_conflict9 *s,int c,int r0,tcg_target_long val,int cf)

{
  byte *pbVar1;
  tcg_insn_unit *ptVar2;
  int *piVar3;
  byte bVar4;
  bool bVar5;
  int rm;
  uint uVar6;
  int opc;
  uint r;
  
  uVar6 = c & 0xfffffff8;
  r = c & 7;
  bVar4 = (byte)r0;
  if (cf == 0) {
    if (r == 5) {
LAB_00d04d59:
      if ((val == 1) || (val == -1)) {
        bVar5 = -1 < val != (r == 0);
        tcg_out_opc(s,uVar6 + 0xff,(uint)bVar5,r0,0);
        bVar4 = (bVar4 & 7) + bVar5 * '\b';
        goto LAB_00d04ef3;
      }
      goto LAB_00d04d38;
    }
    if (r != 4) {
      if (r != 0) goto LAB_00d04e19;
      goto LAB_00d04d59;
    }
  }
  else {
LAB_00d04d38:
    if (r != 4) goto LAB_00d04e19;
  }
  if (val == 0xffffffff) {
    uVar6 = (uint)r0 >> 3 & 1 | (uint)r0 >> 1 & 4;
    if (uVar6 != 0) {
      pbVar1 = s->code_ptr;
      s->code_ptr = pbVar1 + 1;
      *pbVar1 = (byte)uVar6 | 0x40;
    }
    ptVar2 = s->code_ptr;
    s->code_ptr = ptVar2 + 1;
    *ptVar2 = 0x8b;
  }
  else {
    if ((ulong)val >> 0x20 == 0) {
      uVar6 = 0;
    }
    if (val == 0xffff) {
      opc = 0x1b7;
    }
    else {
      if (val != 0xff) {
LAB_00d04e19:
        if ((char)(tcg_insn_unit)val == val) {
          tcg_out_opc(s,uVar6 + 0x83,r,r0,0);
          pbVar1 = s->code_ptr;
          s->code_ptr = pbVar1 + 1;
          *pbVar1 = (bVar4 & 7) + (char)r * '\b' | 0xc0;
          ptVar2 = s->code_ptr;
          s->code_ptr = ptVar2 + 1;
          *ptVar2 = (tcg_insn_unit)val;
          return;
        }
        if ((int)val == val || uVar6 == 0) {
          tcg_out_opc(s,uVar6 + 0x81,r,r0,0);
          pbVar1 = s->code_ptr;
          s->code_ptr = pbVar1 + 1;
          *pbVar1 = (bVar4 & 7) + (char)r * '\b' | 0xc0;
          piVar3 = (int *)s->code_ptr;
          *piVar3 = (int)val;
          s->code_ptr = (tcg_insn_unit *)(piVar3 + 1);
          return;
        }
        tgen_arithi_cold_1();
        tcg_out_opc(s,0x41b6,uVar6,rm,0);
        pbVar1 = s->code_ptr;
        s->code_ptr = pbVar1 + 1;
        *pbVar1 = ((byte)rm & 7) + (char)uVar6 * '\b' | 0xc0;
        return;
      }
      opc = 0x41b6;
    }
    tcg_out_opc(s,opc,r0,r0,0);
  }
  bVar4 = (bVar4 & 7) + bVar4 * '\b';
LAB_00d04ef3:
  pbVar1 = s->code_ptr;
  s->code_ptr = pbVar1 + 1;
  *pbVar1 = bVar4 | 0xc0;
  return;
}

Assistant:

static void tgen_arithi(TCGContext *s, int c, int r0,
                        tcg_target_long val, int cf)
{
    int rexw = 0;

    if (TCG_TARGET_REG_BITS == 64) {
        rexw = c & -8;
        c &= 7;
    }

    /* ??? While INC is 2 bytes shorter than ADDL $1, they also induce
       partial flags update stalls on Pentium4 and are not recommended
       by current Intel optimization manuals.  */
    if (!cf && (c == ARITH_ADD || c == ARITH_SUB) && (val == 1 || val == -1)) {
        int is_inc = (c == ARITH_ADD) ^ (val < 0);
        if (TCG_TARGET_REG_BITS == 64) {
            /* The single-byte increment encodings are re-tasked as the
               REX prefixes.  Use the MODRM encoding.  */
            tcg_out_modrm(s, OPC_GRP5 + rexw,
                          (is_inc ? EXT5_INC_Ev : EXT5_DEC_Ev), r0);
        } else {
            tcg_out8(s, (is_inc ? OPC_INC_r32 : OPC_DEC_r32) + r0);
        }
        return;
    }

    if (c == ARITH_AND) {
        if (TCG_TARGET_REG_BITS == 64) {
            if (val == 0xffffffffu) {
                tcg_out_ext32u(s, r0, r0);
                return;
            }
            if (val == (uint32_t)val) {
                /* AND with no high bits set can use a 32-bit operation.  */
                rexw = 0;
            }
        }
        if (val == 0xffu && (r0 < 4 || TCG_TARGET_REG_BITS == 64)) {
            tcg_out_ext8u(s, r0, r0);
            return;
        }
        if (val == 0xffffu) {
            tcg_out_ext16u(s, r0, r0);
            return;
        }
    }

    if (val == (int8_t)val) {
        tcg_out_modrm(s, OPC_ARITH_EvIb + rexw, c, r0);
        tcg_out8(s, val);
        return;
    }
    if (rexw == 0 || val == (int32_t)val) {
        tcg_out_modrm(s, OPC_ARITH_EvIz + rexw, c, r0);
        tcg_out32(s, val);
        return;
    }

    tcg_abort();
}